

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFLTKWrapUICommand.h
# Opt level: O1

cmCommand * __thiscall cmFLTKWrapUICommand::Clone(cmFLTKWrapUICommand *this)

{
  cmCommand *pcVar1;
  
  pcVar1 = (cmCommand *)operator_new(0x68);
  pcVar1->Makefile = (cmMakefile *)0x0;
  (pcVar1->Error)._M_dataplus._M_p = (pointer)&(pcVar1->Error).field_2;
  (pcVar1->Error)._M_string_length = 0;
  (pcVar1->Error).field_2._M_local_buf[0] = '\0';
  pcVar1->_vptr_cmCommand = (_func_int **)&PTR__cmFLTKWrapUICommand_006361b0;
  pcVar1[1]._vptr_cmCommand = (_func_int **)0x0;
  pcVar1[1].Makefile = (cmMakefile *)0x0;
  pcVar1[1].Error._M_dataplus._M_p = (pointer)0x0;
  pcVar1[1].Error._M_string_length = (size_type)((long)&pcVar1[1].Error.field_2 + 8);
  pcVar1[1].Error.field_2._M_allocated_capacity = 0;
  pcVar1[1].Error.field_2._M_local_buf[8] = '\0';
  return pcVar1;
}

Assistant:

cmCommand* Clone() override { return new cmFLTKWrapUICommand; }